

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Subscription_publishCallback(UA_Server *server,UA_Subscription *sub)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  UA_PublishResponseEntry *pUVar8;
  UA_Subscription *pUVar9;
  UA_SecureChannel *channel_00;
  void *p;
  size_t size;
  undefined4 uVar10;
  UA_NotificationMessage *content;
  UA_PublishResponse *__ptr;
  UA_Subscription *server_00;
  UA_DateTime UVar11;
  UA_UInt32 UVar12;
  ulong uVar13;
  UA_ExtensionObject *pUVar14;
  ulong uVar15;
  undefined1 auStack_1b8 [52];
  uint local_184;
  uint local_180;
  UA_UInt32 local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  uint local_16c;
  UA_Subscription *local_168;
  uint local_15c;
  uint local_158;
  UA_UInt32 local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  UA_Subscription *local_140;
  uint local_134;
  uint local_130;
  UA_UInt32 local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  UA_Subscription *local_118;
  uint local_10c;
  uint local_108;
  UA_UInt32 local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  UA_Subscription *local_f0;
  uint local_e4;
  uint local_e0;
  UA_UInt32 local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  UA_Subscription *local_c8;
  uint local_bc;
  uint local_b8;
  UA_UInt32 local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  UA_Logger local_a0;
  UA_NotificationMessageEntry *local_98;
  UA_NotificationMessageEntry *nme;
  size_t i;
  size_t available;
  UA_NotificationMessageEntry *pUStack_78;
  UA_StatusCode retval;
  UA_NotificationMessageEntry *retransmission;
  UA_NotificationMessage *message;
  UA_PublishResponse *response;
  UA_PublishResponseEntry *pre;
  UA_SecureChannel *channel;
  size_t notifications;
  UA_Subscription *pUStack_40;
  UA_Boolean moreNotifications;
  UA_Subscription *sub_local;
  UA_Server *server_local;
  
  local_a0 = (server->config).logger;
  if (sub->session->channel == (UA_SecureChannel *)0x0) {
    local_a8 = 0;
  }
  else {
    if (sub->session->channel->connection == (UA_Connection *)0x0) {
      local_a4 = 0;
    }
    else {
      local_a4 = sub->session->channel->connection->sockfd;
    }
    local_a8 = local_a4;
  }
  local_ac = local_a8;
  if (sub->session->channel == (UA_SecureChannel *)0x0) {
    local_b0 = 0;
  }
  else {
    local_b0 = (sub->session->channel->securityToken).channelId;
  }
  local_bc = (uint)(sub->session->sessionId).identifier.guid.data3;
  local_b8 = (uint)(sub->session->sessionId).identifier.guid.data4[0];
  local_b4 = sub->subscriptionID;
  pUStack_40 = sub;
  sub_local = (UA_Subscription *)server;
  UA_LOG_DEBUG(local_a0,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Publish Callback"
               ,(ulong)local_a8,(ulong)local_b0,(ulong)(sub->session->sessionId).identifier.numeric,
               (uint)(sub->session->sessionId).identifier.guid.data2,local_bc,local_b8,
               (uint)(sub->session->sessionId).identifier.guid.data4[1],
               (uint)(sub->session->sessionId).identifier.guid.data4[2],
               (uint)(sub->session->sessionId).identifier.guid.data4[3],
               (uint)(sub->session->sessionId).identifier.guid.data4[4],
               (uint)(sub->session->sessionId).identifier.guid.data4[5],
               (uint)(sub->session->sessionId).identifier.guid.data4[6],
               (uint)(sub->session->sessionId).identifier.guid.data4[7],local_b4);
  pUVar14 = (UA_ExtensionObject *)auStack_1b8;
  notifications._7_1_ = 0;
  channel = (UA_SecureChannel *)
            countQueuedNotifications(pUStack_40,(UA_Boolean *)((long)&notifications + 7));
  if (channel == (UA_SecureChannel *)0x0) {
    pUStack_40->currentKeepAliveCount = pUStack_40->currentKeepAliveCount + 1;
    if (pUStack_40->currentKeepAliveCount < pUStack_40->maxKeepAliveCount) {
      return;
    }
    local_c8 = sub_local[1].listEntry.le_next;
    if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
      local_d0 = 0;
    }
    else {
      if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
        local_cc = 0;
      }
      else {
        local_cc = pUStack_40->session->channel->connection->sockfd;
      }
      local_d0 = local_cc;
    }
    local_d4 = local_d0;
    if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
      local_d8 = 0;
    }
    else {
      local_d8 = (pUStack_40->session->channel->securityToken).channelId;
    }
    local_e4 = (uint)(pUStack_40->session->sessionId).identifier.guid.data3;
    local_e0 = (uint)(pUStack_40->session->sessionId).identifier.guid.data4[0];
    local_dc = pUStack_40->subscriptionID;
    UA_LOG_DEBUG((UA_Logger)local_c8,UA_LOGCATEGORY_SESSION,
                 "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Sending a KeepAlive"
                 ,(ulong)local_d0,(ulong)local_d8,
                 (ulong)(pUStack_40->session->sessionId).identifier.numeric,
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data2,local_e4,local_e0,
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[1],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[2],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[3],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[4],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[5],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[6],
                 (uint)(pUStack_40->session->sessionId).identifier.guid.data4[7],local_dc);
  }
  pre = (UA_PublishResponseEntry *)pUStack_40->session->channel;
  if (pre != (UA_PublishResponseEntry *)0x0) {
    response = (UA_PublishResponse *)(pUStack_40->session->responseQueue).sqh_first;
    if ((UA_PublishResponseEntry *)response == (UA_PublishResponseEntry *)0x0) {
      local_f0 = sub_local[1].listEntry.le_next;
      if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
        local_f8 = 0;
      }
      else {
        if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
          local_f4 = 0;
        }
        else {
          local_f4 = pUStack_40->session->channel->connection->sockfd;
        }
        local_f8 = local_f4;
      }
      local_fc = local_f8;
      if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
        local_100 = 0;
      }
      else {
        local_100 = (pUStack_40->session->channel->securityToken).channelId;
      }
      local_10c = (uint)(pUStack_40->session->sessionId).identifier.guid.data3;
      local_108 = (uint)(pUStack_40->session->sessionId).identifier.guid.data4[0];
      local_104 = pUStack_40->subscriptionID;
      UA_LOG_DEBUG((UA_Logger)local_f0,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Cannot send a publish response since the publish queue is empty"
                   ,(ulong)local_f8,(ulong)local_100,
                   (ulong)(pUStack_40->session->sessionId).identifier.numeric,
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data2,local_10c,local_108,
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[1],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[2],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[3],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[4],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[5],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[6],
                   (uint)(pUStack_40->session->sessionId).identifier.guid.data4[7],local_104);
      if (pUStack_40->state == UA_SUBSCRIPTIONSTATE_LATE) {
        pUStack_40->currentLifetimeCount = pUStack_40->currentLifetimeCount + 1;
        if (pUStack_40->lifeTimeCount < pUStack_40->currentLifetimeCount) {
          local_118 = sub_local[1].listEntry.le_next;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_120 = 0;
          }
          else {
            if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
              local_11c = 0;
            }
            else {
              local_11c = pUStack_40->session->channel->connection->sockfd;
            }
            local_120 = local_11c;
          }
          local_124 = local_120;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_128 = 0;
          }
          else {
            local_128 = (pUStack_40->session->channel->securityToken).channelId;
          }
          local_134 = (uint)(pUStack_40->session->sessionId).identifier.guid.data3;
          local_130 = (uint)(pUStack_40->session->sessionId).identifier.guid.data4[0];
          local_12c = pUStack_40->subscriptionID;
          UA_LOG_DEBUG((UA_Logger)local_118,UA_LOGCATEGORY_SESSION,
                       "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | End of lifetime for subscription"
                       ,(ulong)local_120,(ulong)local_128,
                       (ulong)(pUStack_40->session->sessionId).identifier.numeric,
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data2,local_134,
                       local_130,(uint)(pUStack_40->session->sessionId).identifier.guid.data4[1],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[2],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[3],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[4],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[5],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[6],
                       (uint)(pUStack_40->session->sessionId).identifier.guid.data4[7],local_12c);
          UA_Session_deleteSubscription
                    ((UA_Server *)sub_local,pUStack_40->session,pUStack_40->subscriptionID);
        }
      }
      else {
        pUStack_40->state = UA_SUBSCRIPTIONSTATE_LATE;
      }
    }
    else {
      message = (UA_NotificationMessage *)&((UA_PublishResponseEntry *)response)->response;
      retransmission =
           (UA_NotificationMessageEntry *)
           &(((UA_PublishResponseEntry *)response)->response).notificationMessage;
      pUStack_78 = (UA_NotificationMessageEntry *)0x0;
      if (channel != (UA_SecureChannel *)0x0) {
        pUStack_78 = (UA_NotificationMessageEntry *)malloc(0x30);
        if (pUStack_78 == (UA_NotificationMessageEntry *)0x0) {
          local_140 = sub_local[1].listEntry.le_next;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_148 = 0;
          }
          else {
            if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
              local_144 = 0;
            }
            else {
              local_144 = pUStack_40->session->channel->connection->sockfd;
            }
            local_148 = local_144;
          }
          local_14c = local_148;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_150 = 0;
          }
          else {
            local_150 = (pUStack_40->session->channel->securityToken).channelId;
          }
          local_15c = (uint)(pUStack_40->session->sessionId).identifier.guid.data3;
          local_158 = (uint)(pUStack_40->session->sessionId).identifier.guid.data4[0];
          local_154 = pUStack_40->subscriptionID;
          UA_LOG_WARNING((UA_Logger)local_140,UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not allocate memory for retransmission"
                         ,(ulong)local_148,(ulong)local_150,
                         (ulong)(pUStack_40->session->sessionId).identifier.numeric,
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data2,local_15c,
                         local_158,(uint)(pUStack_40->session->sessionId).identifier.guid.data4[1],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[2],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[3],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[4],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[5],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[6],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[7],local_154);
          return;
        }
        available._4_4_ =
             prepareNotificationMessage
                       (pUStack_40,(UA_NotificationMessage *)retransmission,(size_t)channel);
        if (available._4_4_ != 0) {
          local_168 = sub_local[1].listEntry.le_next;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_170 = 0;
          }
          else {
            if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
              local_16c = 0;
            }
            else {
              local_16c = pUStack_40->session->channel->connection->sockfd;
            }
            local_170 = local_16c;
          }
          local_174 = local_170;
          if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
            local_178 = 0;
          }
          else {
            local_178 = (pUStack_40->session->channel->securityToken).channelId;
          }
          local_184 = (uint)(pUStack_40->session->sessionId).identifier.guid.data3;
          local_180 = (uint)(pUStack_40->session->sessionId).identifier.guid.data4[0];
          local_17c = pUStack_40->subscriptionID;
          UA_LOG_WARNING((UA_Logger)local_168,UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Could not prepare the notification message"
                         ,(ulong)local_170,(ulong)local_178,
                         (ulong)(pUStack_40->session->sessionId).identifier.numeric,
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data2,local_184,
                         local_180,(uint)(pUStack_40->session->sessionId).identifier.guid.data4[1],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[2],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[3],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[4],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[5],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[6],
                         (uint)(pUStack_40->session->sessionId).identifier.guid.data4[7],local_17c);
          free(pUStack_78);
          return;
        }
        available._4_4_ = 0;
      }
      pUVar8 = (((pUStack_40->session->responseQueue).sqh_first)->listEntry).sqe_next;
      (pUStack_40->session->responseQueue).sqh_first = pUVar8;
      if (pUVar8 == (UA_PublishResponseEntry *)0x0) {
        (pUStack_40->session->responseQueue).sqh_last =
             &(pUStack_40->session->responseQueue).sqh_first;
      }
      UVar11 = UA_DateTime_now();
      *(UA_DateTime *)message = UVar11;
      *(UA_UInt32 *)&message[4].publishTime = pUStack_40->subscriptionID;
      *(byte *)&message[5].sequenceNumber = notifications._7_1_ & 1;
      (retransmission->listEntry).tqe_prev = *(UA_NotificationMessageEntry ***)message;
      if (channel == (UA_SecureChannel *)0x0) {
        *(UA_UInt32 *)&(retransmission->listEntry).tqe_next = pUStack_40->sequenceNumber + 1;
      }
      else {
        UVar12 = pUStack_40->sequenceNumber + 1;
        pUStack_40->sequenceNumber = UVar12;
        *(UA_UInt32 *)&(retransmission->listEntry).tqe_next = UVar12;
        *(UA_DateTime *)&pUStack_78->message = message[5].publishTime;
        (pUStack_78->message).publishTime = message[5].notificationDataSize;
        (pUStack_78->message).notificationDataSize = (size_t)message[5].notificationData;
        (pUStack_78->message).notificationData = *(UA_ExtensionObject **)(message + 6);
        UA_Subscription_addRetransmissionMessage((UA_Server *)sub_local,pUStack_40,pUStack_78);
      }
      i = (size_t)pUStack_40->retransmissionQueueSize;
      if (i != 0) {
        pUVar14 = (UA_ExtensionObject *)(auStack_1b8 + -(i * 4 + 0xf & 0xfffffffffffffff0));
        message[4].notificationData = pUVar14;
        message[4].notificationDataSize = i;
        nme = (UA_NotificationMessageEntry *)0x0;
        for (local_98 = (pUStack_40->retransmissionQueue).tqh_first;
            local_98 != (UA_NotificationMessageEntry *)0x0;
            local_98 = (local_98->listEntry).tqe_next) {
          (&(message[4].notificationData)->encoding)[(long)nme] = (local_98->message).sequenceNumber
          ;
          nme = (UA_NotificationMessageEntry *)((long)&(nme->listEntry).tqe_next + 1);
        }
      }
      pUVar9 = sub_local[1].listEntry.le_next;
      if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
        auStack_1b8._32_4_ = 0;
      }
      else {
        if (pUStack_40->session->channel->connection == (UA_Connection *)0x0) {
          auStack_1b8._36_4_ = 0;
        }
        else {
          auStack_1b8._36_4_ = pUStack_40->session->channel->connection->sockfd;
        }
        auStack_1b8._32_4_ = auStack_1b8._36_4_;
      }
      auStack_1b8._28_4_ = auStack_1b8._32_4_;
      if (pUStack_40->session->channel == (UA_SecureChannel *)0x0) {
        auStack_1b8._24_4_ = 0;
      }
      else {
        auStack_1b8._24_4_ = (pUStack_40->session->channel->securityToken).channelId;
      }
      uVar13 = (ulong)(uint)auStack_1b8._32_4_;
      uVar15 = (ulong)(uint)auStack_1b8._24_4_;
      uVar7 = (pUStack_40->session->sessionId).identifier.numeric;
      auStack_1b8._8_4_ = ZEXT24((pUStack_40->session->sessionId).identifier.guid.data3);
      auStack_1b8._12_4_ = ZEXT14((pUStack_40->session->sessionId).identifier.guid.data4[0]);
      auStack_1b8._16_4_ = ZEXT14((pUStack_40->session->sessionId).identifier.guid.data4[1]);
      bVar1 = (pUStack_40->session->sessionId).identifier.guid.data4[2];
      bVar2 = (pUStack_40->session->sessionId).identifier.guid.data4[3];
      bVar3 = (pUStack_40->session->sessionId).identifier.guid.data4[4];
      bVar4 = (pUStack_40->session->sessionId).identifier.guid.data4[5];
      bVar5 = (pUStack_40->session->sessionId).identifier.guid.data4[6];
      bVar6 = (pUStack_40->session->sessionId).identifier.guid.data4[7];
      UVar12 = pUStack_40->subscriptionID;
      auStack_1b8._20_4_ = SUB84(channel,0);
      auStack_1b8._40_8_ = pUVar9;
      pUVar14[-2].encoding = (uint)(pUStack_40->session->sessionId).identifier.guid.data2;
      *(undefined4 *)&pUVar14[-2].content = auStack_1b8._8_4_;
      *(undefined4 *)((long)&pUVar14[-2].content + 8) = auStack_1b8._12_4_;
      *(undefined4 *)((long)&pUVar14[-2].content + 0x10) = auStack_1b8._16_4_;
      uVar10 = auStack_1b8._20_4_;
      *(uint *)((long)&pUVar14[-2].content + 0x18) = (uint)bVar1;
      *(uint *)((long)&pUVar14[-2].content + 0x20) = (uint)bVar2;
      pUVar14[-1].encoding = (uint)bVar3;
      *(uint *)&pUVar14[-1].content = (uint)bVar4;
      *(uint *)((long)&pUVar14[-1].content + 8) = (uint)bVar5;
      *(uint *)((long)&pUVar14[-1].content + 0x10) = (uint)bVar6;
      *(UA_UInt32 *)((long)&pUVar14[-1].content + 0x18) = UVar12;
      *(undefined4 *)((long)&pUVar14[-1].content + 0x20) = uVar10;
      pUVar14[-3].content.encoded.body.data = (UA_Byte *)0x136052;
      UA_LOG_DEBUG((UA_Logger)pUVar9,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | Sending out a publish response with %u notifications"
                   ,uVar13,uVar15,(ulong)uVar7);
      content = message;
      channel_00 = pUStack_40->session->channel;
      UVar12 = (response->responseHeader).requestHandle;
      pUVar14[-1].content.encoded.body.data = (UA_Byte *)0x136083;
      UA_SecureChannel_sendBinaryMessage(channel_00,UVar12,content,UA_TYPES + 0x4e);
      pUStack_40->state = UA_SUBSCRIPTIONSTATE_NORMAL;
      pUStack_40->currentKeepAliveCount = 0;
      pUStack_40->currentLifetimeCount = 0;
      p = (void *)message[6].notificationDataSize;
      size = message[6].publishTime;
      pUVar14[-1].content.encoded.body.data = (UA_Byte *)0x1360cd;
      UA_Array_delete(p,size,UA_TYPES + 6);
      __ptr = response;
      pUVar14[-1].content.encoded.body.data = (UA_Byte *)0x1360d6;
      free(__ptr);
      server_00 = sub_local;
      pUVar9 = pUStack_40;
      if ((notifications._7_1_ & 1) != 0) {
        pUVar14[-1].content.encoded.body.data = (UA_Byte *)0x1360e9;
        UA_Subscription_publishCallback((UA_Server *)server_00,pUVar9);
      }
    }
  }
  return;
}

Assistant:

void UA_Subscription_publishCallback(UA_Server *server, UA_Subscription *sub) {
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                         "Publish Callback", sub->subscriptionID);

    /* Count the available notifications */
    UA_Boolean moreNotifications = false;
    size_t notifications = countQueuedNotifications(sub, &moreNotifications);

    /* Return if nothing to do */
    if(notifications == 0) {
        ++sub->currentKeepAliveCount;
        if(sub->currentKeepAliveCount < sub->maxKeepAliveCount)
            return;
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Sending a KeepAlive",
                             sub->subscriptionID)
    }

    /* Check if the securechannel is valid */
    UA_SecureChannel *channel = sub->session->channel;
    if(!channel)
        return;

    /* Dequeue a response */
    UA_PublishResponseEntry *pre = SIMPLEQ_FIRST(&sub->session->responseQueue);

    /* Cannot publish without a response */
    if(!pre) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | Cannot send a publish response "
                             "since the publish queue is empty", sub->subscriptionID)
        if(sub->state != UA_SUBSCRIPTIONSTATE_LATE) {
            sub->state = UA_SUBSCRIPTIONSTATE_LATE;
        } else {
            ++sub->currentLifetimeCount;
            if(sub->currentLifetimeCount > sub->lifeTimeCount) {
                UA_LOG_DEBUG_SESSION(server->config.logger, sub->session, "Subscription %u | "
                                     "End of lifetime for subscription", sub->subscriptionID);
                UA_Session_deleteSubscription(server, sub->session, sub->subscriptionID);
            }
        }
        return;
    }

    UA_PublishResponse *response = &pre->response;
    UA_NotificationMessage *message = &response->notificationMessage;
    UA_NotificationMessageEntry *retransmission = NULL;
    if(notifications > 0) {
        /* Allocate the retransmission entry */
        retransmission = UA_malloc(sizeof(UA_NotificationMessageEntry));
        if(!retransmission) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not allocate memory "
                                   "for retransmission", sub->subscriptionID);
            return;
        }
        /* Prepare the response */
        UA_StatusCode retval =
            prepareNotificationMessage(sub, message, notifications);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | Could not prepare the "
                                   "notification message", sub->subscriptionID);
            UA_free(retransmission);
            return;
        }
    }

    /* <-- The point of no return --> */

    /* Remove the response from the response queue */
    SIMPLEQ_REMOVE_HEAD(&sub->session->responseQueue, listEntry);

    /* Set up the response */
    response->responseHeader.timestamp = UA_DateTime_now();
    response->subscriptionId = sub->subscriptionID;
    response->moreNotifications = moreNotifications;
    message->publishTime = response->responseHeader.timestamp;
    if(notifications == 0) {
        /* Send sequence number for the next notification */
        message->sequenceNumber = sub->sequenceNumber + 1;
    } else {
        /* Increase the sequence number */
        message->sequenceNumber = ++sub->sequenceNumber;

        /* Put the notification message into the retransmission queue. This needs to
         * be done here, so that the message itself is included in the available
         * sequence numbers for acknowledgement. */
        retransmission->message = response->notificationMessage;
        UA_Subscription_addRetransmissionMessage(server, sub, retransmission);
    }

    /* Get the available sequence numbers from the retransmission queue */
    size_t available = sub->retransmissionQueueSize;
    if(available > 0) {
        response->availableSequenceNumbers = UA_alloca(available * sizeof(UA_UInt32));
        response->availableSequenceNumbersSize = available;
        size_t i = 0;
        UA_NotificationMessageEntry *nme;
        TAILQ_FOREACH(nme, &sub->retransmissionQueue, listEntry) {
            response->availableSequenceNumbers[i] = nme->message.sequenceNumber;
            ++i;
        }
    }

    /* Send the response */
    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | Sending out a publish response with %u "
                         "notifications", sub->subscriptionID, (UA_UInt32)notifications);
    UA_SecureChannel_sendBinaryMessage(sub->session->channel, pre->requestId, response,
                                       &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);

    /* Reset subscription state to normal. */
    sub->state = UA_SUBSCRIPTIONSTATE_NORMAL;
    sub->currentKeepAliveCount = 0;
    sub->currentLifetimeCount = 0;

    /* Free the response */
    UA_Array_delete(response->results, response->resultsSize,
                    &UA_TYPES[UA_TYPES_UINT32]);
    UA_free(pre); /* no need for UA_PublishResponse_deleteMembers */

    /* Repeat if there are more notifications to send */
    if(moreNotifications)
        UA_Subscription_publishCallback(server, sub);
}